

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

float ** Emb_ManMatrAlloc(int nDims)

{
  float **ppfVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)nDims;
  ppfVar1 = (float **)malloc((lVar3 * 4 + 8) * lVar3);
  *ppfVar1 = (float *)(ppfVar1 + lVar3);
  if (1 < nDims) {
    pfVar2 = *ppfVar1;
    uVar4 = 1;
    do {
      pfVar2 = pfVar2 + lVar3;
      ppfVar1[uVar4] = pfVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)nDims != uVar4);
  }
  return ppfVar1;
}

Assistant:

float ** Emb_ManMatrAlloc( int nDims )
{
    int i;
    float ** pMatr = (float **)ABC_ALLOC( char, sizeof(float *) * nDims + sizeof(float) * nDims * nDims );
    pMatr[0] = (float *)(pMatr + nDims);
    for ( i = 1; i < nDims; i++ )
        pMatr[i] = pMatr[i-1] + nDims;
    return pMatr;
}